

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.h
# Opt level: O2

void __thiscall Net::Train(Net *this)

{
  Matrix<float,_64,_1,_0,_64,_1> *this_00;
  Matrix<float,_64,_35,_0,_64,_35> *this_01;
  Matrix<float,_35,_1,_0,_35,_1> *this_02;
  Matrix<float,_35,_1,_0,_35,_1> *this_03;
  Matrix<float,_64,_1,_0,_64,_1> *this_04;
  float fVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  size_t h;
  long lVar7;
  size_t j_3;
  size_t h_2;
  long lVar8;
  size_t h_1;
  size_t j_2;
  ReturnType RVar9;
  ResScalar RVar10;
  Scalar SVar11;
  float fVar12;
  ResScalar RVar13;
  double dVar14;
  MatrixXf cur;
  Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true> local_98;
  BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true> local_60;
  
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<float,12,6,0,12,6>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&cur,
             (DenseBase<Eigen::Matrix<float,_12,_6,_0,_12,_6>_> *)&this->pool2);
  Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&cur,0x48,1);
  this_00 = &this->b;
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
    Eigen::Block<Eigen::Matrix<float,_72,_64,_0,_72,_64>,_72,_1,_true>::Block
              ((Block<Eigen::Matrix<float,_72,_64,_0,_72,_64>,_72,_1,_true> *)&local_60,&this->v,
               lVar7);
    Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_98,&cur,0);
    RVar9 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,72,64,0,72,64>,72,1,true>>::
            dot<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<float,72,64,0,72,64>,72,1,true>> *)
                       &local_60,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                        *)&local_98);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1> *)&this->r,lVar7,
                        0);
    dVar14 = exp(-((double)RVar9 - (double)*pSVar2));
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)this_00,lVar7,0
                       );
    *pSVar3 = (float)(1.0 / (dVar14 + 1.0));
  }
  this_01 = &this->w;
  this_02 = &this->yc;
  for (lVar7 = 0; lVar7 != 0x23; lVar7 = lVar7 + 1) {
    Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>::Block
              (&local_98,this_01,lVar7);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>::
    BlockImpl_dense(&local_60,this_00,0);
    RVar10 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>_>
                    *)&local_98,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>_> *)
                   &local_60);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->o,lVar7,
                        0);
    dVar14 = exp((double)RVar10 - (double)*pSVar4);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)this_02,lVar7,0
                       );
    *pSVar4 = (float)dVar14;
  }
  SVar11 = Eigen::DenseBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>::sum
                     ((DenseBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_> *)this_02);
  for (lVar7 = 0; lVar7 != 0x23; lVar7 = lVar7 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)this_02,lVar7,0
                       );
    fVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)this_02,lVar7,0
                       );
    *pSVar4 = fVar1 / SVar11;
  }
  this->ek = 0.0;
  this_03 = &this->g;
  for (lVar7 = 0; lVar7 != 0x23; lVar7 = lVar7 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)this_02,lVar7);
    fVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->y,lVar7)
    ;
    fVar12 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)this_03,lVar7);
    *pSVar4 = fVar1 - fVar12;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->y,lVar7)
    ;
    fVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)this_02,lVar7);
    fVar12 = logf(*pSVar4);
    this->ek = this->ek - (double)(fVar1 * fVar12);
  }
  this_04 = &this->e;
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
    Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_1,_35,_false>::Block
              ((Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_1,_35,_false> *)&local_98,this_01,
               lVar7);
    RVar13 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_1,_35,_false>,_Eigen::Matrix<float,_35,_1,_0,_35,_1>,_true>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_1,_35,_false>_>
                    *)&local_98,(MatrixBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_> *)this_03);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)this_00,lVar7);
    fVar1 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)this_00,lVar7);
    fVar12 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)this_04,lVar7);
    *pSVar3 = RVar13 * fVar1 * (1.0 - fVar12);
  }
  for (lVar7 = 0; lVar7 != 0x48; lVar7 = lVar7 + 1) {
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)this_04,lVar8
                         );
      fVar1 = *pSVar3;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1> *)&this->x,
                          lVar7);
      fVar12 = *pSVar2;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>,_1> *)&this->v,
                          lVar7,lVar8);
      *pSVar5 = fVar1 * -0.3 * fVar12 + *pSVar5;
    }
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
    for (lVar8 = 0; lVar8 != 0x23; lVar8 = lVar8 + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)this_03,lVar8
                         );
      fVar1 = *pSVar4;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)this_00,lVar7
                         );
      fVar12 = *pSVar3;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_1> *)this_01,
                          lVar7,lVar8);
      *pSVar6 = fVar1 * -0.4 * fVar12 + *pSVar6;
    }
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_1> *)this_04,lVar7);
    fVar1 = *pSVar3;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>,_1> *)&this->r,lVar7)
    ;
    *pSVar2 = fVar1 * -0.3 + *pSVar2;
  }
  for (lVar7 = 0; lVar7 != 0x23; lVar7 = lVar7 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)this_03,lVar7);
    fVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>,_1> *)&this->o,lVar7)
    ;
    *pSVar4 = fVar1 * -0.4 + *pSVar4;
  }
  free(cur.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void Net::Train()
{
    //pool2.normalize();// use sigmod for hidden layer
    MatrixXf cur = pool2;
    cur.resize(D,1);

    /* Compute b[h], hidden layer output */
    for (size_t h = 0; h < Q; h++) {
        double alpha_h = v.col(h).dot(cur.col(0));
//        double alpha_h = 0;
//        for (size_t i = 0; i < D; i++)
//            alpha_h += v(i,h) * cur(i,0);
        b(h,0) = ACTIVE(alpha_h - r(h,0));
    }

    /* Compute yc[j] ,output layer output */
    for (size_t j = 0; j < L; j++) {
        double beta_j = 0;
        beta_j = w.col(j).dot(b.col(0));
//        for (size_t h = 0; h < Q; h++)
//            beta_j += w[h][j] * b[h];
        yc(j,0) = exp(beta_j - o(j,0));
    }
    /*softmax activation*/
    float SUM = yc.sum();
    for (size_t j = 0; j < L; j++)
    {
        yc(j,0) = yc(j,0)/SUM;
    }

    ek = 0;

    /* Compute g[j] and E ,g[i] is the output layer point loss, Ek is the output layer loss*/
    for (size_t j = 0; j < L; j++) {
        g[j] =  (yc[j] - y[j]);// update b for output layer, when update the b, plus g
        ek -= y[j]*log(yc[j]); //
    }

    /* Compute e[h] , e[h] is the hidden layer loss*/
    for (size_t h = 0; h < Q; h++) {
        double temp = 0;
        temp = w.row(h).dot(g);
        e[h] = b[h] * (1 - b[h]) * temp;
    }

    /* Update v[i][h], w[h][j], r[h], o[j] */
    for (size_t i = 0; i < D; i++)
        for (size_t h = 0; h < Q; h++)
            v(i,h) -= LEARN_RATE1 * e[h] * x[i];
    for (size_t h = 0; h < Q; h++)
        for (size_t j = 0; j < L; j++)
            w(h,j) -= LEARN_RATE2 * g[j] * b[h];

    for (size_t h = 0; h < Q; h++)
        r[h] -= ((LEARN_RATE1) * e[h]);

    for (size_t j = 0; j < L; j++)
        o[j] -= ((LEARN_RATE2) * g[j]);
}